

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O0

char * Qiniu_RS_PutPolicy_Token(Qiniu_RS_PutPolicy *auth,Qiniu_Mac *mac)

{
  cJSON *object;
  cJSON *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  cJSON *root;
  char *token;
  char *authstr;
  time_t deadline;
  Qiniu_Mac *pQStack_18;
  int expires;
  Qiniu_Mac *mac_local;
  Qiniu_RS_PutPolicy *auth_local;
  
  pQStack_18 = mac;
  mac_local = (Qiniu_Mac *)auth;
  object = cJSON_CreateObject();
  if (mac_local->accessKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local->accessKey);
    cJSON_AddItemToObject(object,"scope",pcVar1);
  }
  if (*(int *)&mac_local[1].accessKey != 0) {
    pcVar1 = cJSON_CreateNumber((double)*(uint *)&mac_local[1].accessKey);
    cJSON_AddItemToObject(object,"isPrefixalScope",pcVar1);
  }
  if (mac_local->secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local->secretKey);
    cJSON_AddItemToObject(object,"saveKey",pcVar1);
  }
  if (mac_local[1].secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[1].secretKey);
    cJSON_AddItemToObject(object,"callbackUrl",pcVar1);
  }
  if (mac_local[2].accessKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[2].accessKey);
    cJSON_AddItemToObject(object,"callbackHost",pcVar1);
  }
  if (mac_local[2].secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[2].secretKey);
    cJSON_AddItemToObject(object,"callbackBody",pcVar1);
  }
  if (mac_local[3].accessKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[3].accessKey);
    cJSON_AddItemToObject(object,"callbackBodyType",pcVar1);
  }
  if (mac_local[3].secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[3].secretKey);
    cJSON_AddItemToObject(object,"callbackFetchKey",pcVar1);
  }
  if (mac_local[4].accessKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[4].accessKey);
    cJSON_AddItemToObject(object,"returnUrl",pcVar1);
  }
  if (mac_local[4].secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[4].secretKey);
    cJSON_AddItemToObject(object,"returnBody",pcVar1);
  }
  if (mac_local[5].accessKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[5].accessKey);
    cJSON_AddItemToObject(object,"endUser",pcVar1);
  }
  if (mac_local[5].secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[5].secretKey);
    cJSON_AddItemToObject(object,"persistentOps",pcVar1);
  }
  if (mac_local[6].accessKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[6].accessKey);
    cJSON_AddItemToObject(object,"persistentNotifyUrl",pcVar1);
  }
  if (mac_local[6].secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[6].secretKey);
    cJSON_AddItemToObject(object,"persistentPipeline",pcVar1);
  }
  if (mac_local[7].accessKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[7].accessKey);
    cJSON_AddItemToObject(object,"persistentWorkflowTemplateID",pcVar1);
  }
  if (mac_local[7].secretKey != (char *)0x0) {
    pcVar1 = cJSON_CreateString(mac_local[7].secretKey);
    cJSON_AddItemToObject(object,"mimeLimit",pcVar1);
  }
  if (mac_local[8].secretKey != (char *)0x0) {
    pcVar2 = mac_local[8].accessKey;
    auVar4._8_4_ = (int)((ulong)pcVar2 >> 0x20);
    auVar4._0_8_ = pcVar2;
    auVar4._12_4_ = 0x45300000;
    pcVar1 = cJSON_CreateNumber((auVar4._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)pcVar2) - 4503599627370496.0));
    cJSON_AddItemToObject(object,"fsizeMin",pcVar1);
  }
  if (mac_local[8].accessKey != (char *)0x0) {
    pcVar2 = mac_local[8].accessKey;
    auVar5._8_4_ = (int)((ulong)pcVar2 >> 0x20);
    auVar5._0_8_ = pcVar2;
    auVar5._12_4_ = 0x45300000;
    pcVar1 = cJSON_CreateNumber((auVar5._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)pcVar2) - 4503599627370496.0));
    cJSON_AddItemToObject(object,"fsizeLimit",pcVar1);
  }
  if (*(int *)&mac_local[9].accessKey != 0) {
    pcVar1 = cJSON_CreateNumber((double)*(uint *)&mac_local[9].accessKey);
    cJSON_AddItemToObject(object,"detectMime",pcVar1);
  }
  if (*(int *)((long)&mac_local[9].accessKey + 4) != 0) {
    pcVar1 = cJSON_CreateNumber((double)*(uint *)((long)&mac_local[9].accessKey + 4));
    cJSON_AddItemToObject(object,"insertOnly",pcVar1);
  }
  if (*(int *)((long)&mac_local[9].secretKey + 4) != 0) {
    pcVar1 = cJSON_CreateNumber((double)*(uint *)((long)&mac_local[9].secretKey + 4));
    cJSON_AddItemToObject(object,"deleteAfterDays",pcVar1);
  }
  if (*(int *)&mac_local[10].accessKey != 0) {
    pcVar1 = cJSON_CreateNumber((double)*(uint *)&mac_local[10].accessKey);
    cJSON_AddItemToObject(object,"fileType",pcVar1);
  }
  if (*(int *)((long)&mac_local[10].accessKey + 4) != 0) {
    pcVar1 = cJSON_CreateNumber((double)*(uint *)((long)&mac_local[10].accessKey + 4));
    cJSON_AddItemToObject(object,"persistentType",pcVar1);
  }
  if (*(int *)&mac_local[9].secretKey == 0) {
    deadline._4_4_ = 0xe10;
  }
  else {
    deadline._4_4_ = *(int *)&mac_local[9].secretKey;
  }
  time((time_t *)&authstr);
  authstr = authstr + deadline._4_4_;
  pcVar1 = cJSON_CreateNumber((double)(long)authstr);
  cJSON_AddItemToObject(object,"deadline",pcVar1);
  pcVar2 = cJSON_PrintUnformatted(object);
  cJSON_Delete(object);
  pcVar3 = Qiniu_Mac_SignToken(pQStack_18,pcVar2);
  Qiniu_Free(pcVar2);
  return pcVar3;
}

Assistant:

char *Qiniu_RS_PutPolicy_Token(Qiniu_RS_PutPolicy *auth, Qiniu_Mac *mac)
{
    int expires;
    time_t deadline;
    char *authstr;
    char *token;

    cJSON *root = cJSON_CreateObject();

    if (auth->scope)
    {
        cJSON_AddStringToObject(root, "scope", auth->scope);
    }
    if (auth->isPrefixalScope)
    {
        cJSON_AddNumberToObject(root, "isPrefixalScope", auth->isPrefixalScope);
    }
    if (auth->saveKey)
    {
        cJSON_AddStringToObject(root, "saveKey", auth->saveKey);
    }
    if (auth->callbackUrl)
    {
        cJSON_AddStringToObject(root, "callbackUrl", auth->callbackUrl);
    }
    if (auth->callbackHost)
    {
        cJSON_AddStringToObject(root, "callbackHost", auth->callbackHost);
    }
    if (auth->callbackBody)
    {
        cJSON_AddStringToObject(root, "callbackBody", auth->callbackBody);
    }
    if (auth->callbackBodyType)
    {
        cJSON_AddStringToObject(root, "callbackBodyType", auth->callbackBodyType);
    }
    if (auth->callbackFetchKey)
    {
        cJSON_AddStringToObject(root, "callbackFetchKey", auth->callbackFetchKey);
    }
    if (auth->returnUrl)
    {
        cJSON_AddStringToObject(root, "returnUrl", auth->returnUrl);
    }
    if (auth->returnBody)
    {
        cJSON_AddStringToObject(root, "returnBody", auth->returnBody);
    }
    if (auth->endUser)
    {
        cJSON_AddStringToObject(root, "endUser", auth->endUser);
    }
    if (auth->persistentOps)
    {
        cJSON_AddStringToObject(root, "persistentOps", auth->persistentOps);
    }
    if (auth->persistentNotifyUrl)
    {
        cJSON_AddStringToObject(root, "persistentNotifyUrl", auth->persistentNotifyUrl);
    }
    if (auth->persistentPipeline)
    {
        cJSON_AddStringToObject(root, "persistentPipeline", auth->persistentPipeline);
    }
    if (auth->persistentWorkflowTemplateID)
    {
        cJSON_AddStringToObject(root, "persistentWorkflowTemplateID", auth->persistentWorkflowTemplateID);
    }
    if (auth->mimeLimit)
    {
        cJSON_AddStringToObject(root, "mimeLimit", auth->mimeLimit);
    }
    if (auth->fsizeMin)
    {
        cJSON_AddNumberToObject(root, "fsizeMin", auth->fsizeLimit);
    }
    if (auth->fsizeLimit)
    {
        cJSON_AddNumberToObject(root, "fsizeLimit", auth->fsizeLimit);
    }
    if (auth->detectMime)
    {
        cJSON_AddNumberToObject(root, "detectMime", auth->detectMime);
    }
    if (auth->insertOnly)
    {
        cJSON_AddNumberToObject(root, "insertOnly", auth->insertOnly);
    }
    if (auth->deleteAfterDays)
    {
        cJSON_AddNumberToObject(root, "deleteAfterDays", auth->deleteAfterDays);
    }
    if (auth->fileType)
    {
        cJSON_AddNumberToObject(root, "fileType", auth->fileType);
    }
    if (auth->persistentType)
    {
        cJSON_AddNumberToObject(root, "persistentType", auth->persistentType);
    }

    if (auth->expires)
    {
        expires = auth->expires;
    }
    else
    {
        expires = 3600; // 1小时
    }
    time(&deadline);
    deadline += expires;
    cJSON_AddNumberToObject(root, "deadline", deadline);

    authstr = cJSON_PrintUnformatted(root);
    cJSON_Delete(root);

    token = Qiniu_Mac_SignToken(mac, authstr);
    Qiniu_Free(authstr);

    return token;
}